

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaParseIncludeOrRedefineAttrs
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node,
              xmlChar **schemaLocation,int type)

{
  int iVar1;
  xmlAttrPtr attr_00;
  xmlSchemaTypePtr type_00;
  xmlChar *pxVar2;
  xmlChar *local_50;
  xmlChar *uri;
  xmlChar *base;
  xmlAttrPtr attr;
  int type_local;
  xmlChar **schemaLocation_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if ((((pctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
      (node == (xmlNodePtr)0x0)) || (schemaLocation == (xmlChar **)0x0)) {
    return -1;
  }
  *schemaLocation = (xmlChar *)0x0;
  for (base = (xmlChar *)node->properties; base != (xmlChar *)0x0; base = *(xmlChar **)(base + 0x30)
      ) {
    if (*(long *)(base + 0x48) == 0) {
      iVar1 = xmlStrEqual(*(xmlChar **)(base + 0x10),"id");
      if ((iVar1 == 0) &&
         (iVar1 = xmlStrEqual(*(xmlChar **)(base + 0x10),"schemaLocation"), iVar1 == 0)) {
        xmlSchemaPIllegalAttrErr
                  (pctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,
                   (xmlAttrPtr)base);
      }
    }
    else {
      iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(base + 0x48) + 0x10),xmlSchemaNs);
      if (iVar1 != 0) {
        xmlSchemaPIllegalAttrErr
                  (pctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,
                   (xmlAttrPtr)base);
      }
    }
  }
  xmlSchemaPValAttrID(pctxt,node,"id");
  attr_00 = xmlSchemaGetPropNode(node,"schemaLocation");
  if (attr_00 == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (pctxt,XML_SCHEMAP_S4S_ATTR_MISSING,(xmlSchemaBasicItemPtr)0x0,node,"schemaLocation",
               (char *)0x0);
  }
  else {
    type_00 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
    iVar1 = xmlSchemaPValAttrNode(pctxt,(xmlSchemaBasicItemPtr)0x0,attr_00,type_00,schemaLocation);
    if (iVar1 == 0) {
      pxVar2 = xmlNodeGetBase(node->doc,node);
      if (pxVar2 == (xmlChar *)0x0) {
        local_50 = xmlBuildURI(*schemaLocation,node->doc->URL);
      }
      else {
        local_50 = xmlBuildURI(*schemaLocation,pxVar2);
        (*xmlFree)(pxVar2);
      }
      if (local_50 == (xmlChar *)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseIncludeOrRedefine",
                   "could not build an URI from the schemaLocation");
        return -1;
      }
      pxVar2 = xmlDictLookup(pctxt->dict,local_50,-1);
      *schemaLocation = pxVar2;
      (*xmlFree)(local_50);
      iVar1 = xmlStrEqual(*schemaLocation,pctxt->URL);
      if (iVar1 == 0) {
        return 0;
      }
      if (type == 3) {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
                            "The schema document \'%s\' cannot redefine itself.",*schemaLocation);
      }
      else {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_SRC_INCLUDE,(xmlSchemaBasicItemPtr)0x0,node,
                            "The schema document \'%s\' cannot include itself.",*schemaLocation);
      }
    }
  }
  return pctxt->err;
}

Assistant:

static int
xmlSchemaParseIncludeOrRedefineAttrs(xmlSchemaParserCtxtPtr pctxt,
				     xmlSchemaPtr schema,
				     xmlNodePtr node,
				     xmlChar **schemaLocation,
				     int type)
{
    xmlAttrPtr attr;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL) ||
	(schemaLocation == NULL))
        return (-1);

    *schemaLocation = NULL;
    /*
    * Check for illegal attributes.
    * Applies for both <include> and <redefine>.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "schemaLocation"))) {
		xmlSchemaPIllegalAttrErr(pctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(pctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(pctxt, node, BAD_CAST "id");
    /*
    * Preliminary step, extract the URI-Reference and make an URI
    * from the base.
    */
    /*
    * Attribute "schemaLocation" is mandatory.
    */
    attr = xmlSchemaGetPropNode(node, "schemaLocation");
    if (attr != NULL) {
        xmlChar *base = NULL;
        xmlChar *uri = NULL;

	if (xmlSchemaPValAttrNode(pctxt, NULL, attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI),
	    (const xmlChar **) schemaLocation) != 0)
	    goto exit_error;
	base = xmlNodeGetBase(node->doc, node);
	if (base == NULL) {
	    uri = xmlBuildURI(*schemaLocation, node->doc->URL);
	} else {
	    uri = xmlBuildURI(*schemaLocation, base);
	    xmlFree(base);
	}
	if (uri == NULL) {
	    PERROR_INT("xmlSchemaParseIncludeOrRedefine",
		"could not build an URI from the schemaLocation")
	    goto exit_failure;
	}
	(*schemaLocation) = (xmlChar *) xmlDictLookup(pctxt->dict, uri, -1);
	xmlFree(uri);
    } else {
	xmlSchemaPMissingAttrErr(pctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "schemaLocation", NULL);
	goto exit_error;
    }
    /*
    * Report self-inclusion and self-redefinition.
    */
    if (xmlStrEqual(*schemaLocation, pctxt->URL)) {
	if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	    xmlSchemaPCustomErr(pctxt,
		XML_SCHEMAP_SRC_REDEFINE,
		NULL, node,
		"The schema document '%s' cannot redefine itself.",
		*schemaLocation);
	} else {
	    xmlSchemaPCustomErr(pctxt,
		XML_SCHEMAP_SRC_INCLUDE,
		NULL, node,
		"The schema document '%s' cannot include itself.",
		*schemaLocation);
	}
	goto exit_error;
    }

    return(0);
exit_error:
    return(pctxt->err);
exit_failure:
    return(-1);
}